

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O3

uint32_t helper_neon_sqadd_u32_aarch64(CPUARMState_conflict *env,uint32_t a,uint32_t b)

{
  long lVar1;
  
  lVar1 = (long)(int)b + (ulong)a;
  if (0x7fffffff < lVar1) {
    (env->vfp).qc[0] = 1;
    lVar1 = 0x7fffffff;
  }
  return (uint32_t)lVar1;
}

Assistant:

uint32_t HELPER(neon_sqadd_u32)(CPUARMState *env, uint32_t a, uint32_t b)
{
    int64_t res;
    int64_t op1 = (uint32_t)a;
    int64_t op2 = (int32_t)b;
    res = op1 + op2;
    if (res > INT32_MAX) {
        SET_QC();
        res = INT32_MAX;
    } else if (res < INT32_MIN) {
        SET_QC();
        res = INT32_MIN;
    }
    return res;
}